

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

void __thiscall Fl_Text_Buffer::replace(Fl_Text_Buffer *this,int start,int end,char *text)

{
  int nInserted_00;
  char *deletedText_00;
  int nInserted;
  char *deletedText;
  char *text_local;
  int end_local;
  int start_local;
  Fl_Text_Buffer *this_local;
  
  if (text != (char *)0x0) {
    text_local._4_4_ = start;
    if (start < 0) {
      text_local._4_4_ = 0;
    }
    text_local._0_4_ = end;
    if (this->mLength < end) {
      text_local._0_4_ = this->mLength;
    }
    call_predelete_callbacks(this,text_local._4_4_,(int)text_local - text_local._4_4_);
    deletedText_00 = text_range(this,text_local._4_4_,(int)text_local);
    remove_(this,text_local._4_4_,(int)text_local);
    nInserted_00 = insert_(this,text_local._4_4_,text);
    this->mCursorPosHint = text_local._4_4_ + nInserted_00;
    call_modify_callbacks
              (this,text_local._4_4_,(int)text_local - text_local._4_4_,nInserted_00,0,
               deletedText_00);
    free(deletedText_00);
  }
  return;
}

Assistant:

void Fl_Text_Buffer::replace(int start, int end, const char *text)
{
  // Range check...
  if (!text)
    return;
  if (start < 0)
    start = 0;
  if (end > mLength)
    end = mLength;

  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))
  IS_UTF8_ALIGNED(text)
  
  call_predelete_callbacks(start, end - start);
  const char *deletedText = text_range(start, end);
  remove_(start, end);
  int nInserted = insert_(start, text);
  mCursorPosHint = start + nInserted;
  call_modify_callbacks(start, end - start, nInserted, 0, deletedText);
  free((void *) deletedText);
}